

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_on_client_failed(intptr_t uuid,void *set_)

{
  void *ptr;
  
  ptr = *(void **)((long)set_ + 0x20);
  *(undefined8 *)((long)set_ + 0x20) = *(undefined8 *)((long)ptr + 0x78);
  fiobj_free(*(FIOBJ *)((long)ptr + 0x28));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x30));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x10));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x58));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x38));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x50));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x48));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x60));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x70));
  fiobj_free(*(FIOBJ *)((long)ptr + 0x68));
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined8 *)((long)ptr + 0x78) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  fio_free(ptr);
  if (*(code **)((long)set_ + 0x18) != (code *)0x0) {
    (**(code **)((long)set_ + 0x18))(set_);
  }
  free(*(void **)((long)set_ + 0x28));
  free(set_);
  return;
}

Assistant:

static void http_on_client_failed(intptr_t uuid, void *set_) {
  http_settings_s *set = set_;
  http_s *h = set->udata;
  set->udata = h->udata;
  http_s_destroy(h, 0);
  fio_free(h);
  if (set->on_finish)
    set->on_finish(set);
  http_settings_free(set);
  (void)uuid;
}